

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_2,_0>::getDerivatives
          (BeagleCPUImpl<double,_2,_0> *this,double *outSumFirstDerivative,
          double *outSumSecondDerivative)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int i_1;
  int i;
  double *outSumSecondDerivative_local;
  double *outSumFirstDerivative_local;
  BeagleCPUImpl<double,_2,_0> *this_local;
  
  *outSumFirstDerivative = 0.0;
  for (i = 0; i < this->kPatternCount; i = i + 1) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = this->outFirstDerivativesTmp[i];
    auVar1._8_8_ = 0;
    auVar1._0_8_ = this->gPatternWeights[i];
    auVar5._8_8_ = 0;
    auVar5._0_8_ = *outSumFirstDerivative;
    auVar1 = vfmadd213sd_fma(auVar1,auVar3,auVar5);
    *outSumFirstDerivative = auVar1._0_8_;
  }
  if (outSumSecondDerivative != (double *)0x0) {
    *outSumSecondDerivative = 0.0;
    for (i_1 = 0; i_1 < this->kPatternCount; i_1 = i_1 + 1) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = this->outSecondDerivativesTmp[i_1];
      auVar2._8_8_ = 0;
      auVar2._0_8_ = this->gPatternWeights[i_1];
      auVar6._8_8_ = 0;
      auVar6._0_8_ = *outSumSecondDerivative;
      auVar1 = vfmadd213sd_fma(auVar2,auVar4,auVar6);
      *outSumSecondDerivative = auVar1._0_8_;
    }
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::getDerivatives(double* outSumFirstDerivative,
                                                      double* outSumSecondDerivative) {

    *outSumFirstDerivative = 0.0;
    for (int i = 0; i < kPatternCount; i++) {
        *outSumFirstDerivative += outFirstDerivativesTmp[i] * gPatternWeights[i];
    }

    if (outSumSecondDerivative != NULL) {
        *outSumSecondDerivative = 0.0;
        for (int i = 0; i < kPatternCount; i++) {
            *outSumSecondDerivative += outSecondDerivativesTmp[i] * gPatternWeights[i];
        }
    }

    return BEAGLE_SUCCESS;
}